

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Simplex_tree.h
# Opt level: O1

Simplex_handle __thiscall
Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>::edge_with_same_filtration
          (Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence> *this,Simplex_handle *sh)

{
  float fVar1;
  long lVar2;
  Filtration_value *pFVar3;
  undefined8 *puVar4;
  char *pcVar5;
  undefined8 *in_RDX;
  long lVar6;
  int iVar7;
  long lVar8;
  Siblings *pSVar9;
  bool bVar10;
  int w;
  Static_vertex_vector suffix;
  undefined1 local_128 [32];
  Simplex_handle local_108;
  Simplex_handle local_100;
  int local_f8 [40];
  ulong local_58;
  Simplex_vertex_range local_50;
  
  local_100.m_ptr =
       (pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>
        *)*in_RDX;
  simplex_vertex_range
            (&local_50,(Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence> *)sh,&local_100);
  if (local_50.
      super_iterator_range_base<Gudhi::Simplex_tree_simplex_vertex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>,_boost::iterators::incrementable_traversal_tag>
      .m_Begin.v_ ==
      local_50.
      super_iterator_range_base<Gudhi::Simplex_tree_simplex_vertex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>,_boost::iterators::incrementable_traversal_tag>
      .m_End.v_ &&
      local_50.
      super_iterator_range_base<Gudhi::Simplex_tree_simplex_vertex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>,_boost::iterators::incrementable_traversal_tag>
      .m_Begin.sib_ ==
      local_50.
      super_iterator_range_base<Gudhi::Simplex_tree_simplex_vertex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>,_boost::iterators::incrementable_traversal_tag>
      .m_End.sib_) {
    puVar4 = (undefined8 *)__cxa_allocate_exception(8);
    pcVar5 = "empty simplex";
  }
  else {
    iVar7 = (local_50.
             super_iterator_range_base<Gudhi::Simplex_tree_simplex_vertex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>,_boost::iterators::incrementable_traversal_tag>
             .m_Begin.sib_)->parent_;
    pSVar9 = (local_50.
              super_iterator_range_base<Gudhi::Simplex_tree_simplex_vertex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>,_boost::iterators::incrementable_traversal_tag>
              .m_Begin.sib_)->oncles_;
    if (iVar7 != local_50.
                 super_iterator_range_base<Gudhi::Simplex_tree_simplex_vertex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>,_boost::iterators::incrementable_traversal_tag>
                 .m_End.v_ ||
        pSVar9 != local_50.
                  super_iterator_range_base<Gudhi::Simplex_tree_simplex_vertex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>,_boost::iterators::incrementable_traversal_tag>
                  .m_End.sib_) {
      if ((pSVar9->oncles_ ==
           local_50.
           super_iterator_range_base<Gudhi::Simplex_tree_simplex_vertex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>,_boost::iterators::incrementable_traversal_tag>
           .m_End.sib_) &&
         (pSVar9->parent_ ==
          local_50.
          super_iterator_range_base<Gudhi::Simplex_tree_simplex_vertex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>,_boost::iterators::incrementable_traversal_tag>
          .m_End.v_)) {
        (this->nodes_label_to_list_)._M_h._M_buckets = (__buckets_ptr)*in_RDX;
      }
      else {
        local_f8[0] = local_50.
                      super_iterator_range_base<Gudhi::Simplex_tree_simplex_vertex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>,_boost::iterators::incrementable_traversal_tag>
                      .m_Begin.v_;
        local_58 = 1;
        local_108.m_ptr =
             (pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>
              *)*in_RDX;
        pFVar3 = filtration_(&local_108);
        fVar1 = *pFVar3;
        local_128._8_8_ =
             local_50.
             super_iterator_range_base<Gudhi::Simplex_tree_simplex_vertex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>,_boost::iterators::incrementable_traversal_tag>
             .m_End.sib_;
        local_128._16_8_ = sh;
        do {
          find_vertex((Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence> *)local_128,
                      (Vertex_handle)local_128._16_8_);
          bVar10 = local_58 == 0;
          if (!bVar10) {
            lVar2 = *(long *)(CONCAT44(local_128._4_4_,local_128._0_4_) + 0x10);
            lVar6 = local_58 << 2;
            lVar8 = 0;
            do {
              local_128._0_4_ = *(undefined4 *)((long)local_f8 + lVar8);
              boost::container::dtl::
              flat_tree<boost::container::dtl::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>,_boost::container::dtl::select1st<int>,_std::less<int>,_boost::container::new_allocator<boost::container::dtl::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>_>_>
              ::find((flat_tree<boost::container::dtl::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>,_boost::container::dtl::select1st<int>,_std::less<int>,_boost::container::new_allocator<boost::container::dtl::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>_>_>
                      *)this,(key_type *)(lVar2 + 0x10));
              local_128._24_8_ = (this->nodes_label_to_list_)._M_h._M_buckets;
              pFVar3 = filtration_((Simplex_handle *)(local_128 + 0x18));
              if ((*pFVar3 == fVar1) && (!NAN(*pFVar3) && !NAN(fVar1))) {
                return (Simplex_handle)
                       (pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>
                        *)this;
              }
              lVar8 = lVar8 + 4;
              bVar10 = lVar6 == lVar8;
            } while (!bVar10);
          }
          if (0x27 < local_58) {
            boost::container::dtl::static_storage_allocator<int,_40UL,_0UL,_true>::
            on_capacity_overflow();
          }
          local_f8[local_58] = iVar7;
          local_58 = local_58 + 1;
          if (!bVar10) {
            return (Simplex_handle)
                   (pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>
                    *)this;
          }
          iVar7 = pSVar9->parent_;
          pSVar9 = pSVar9->oncles_;
        } while (iVar7 != local_50.
                          super_iterator_range_base<Gudhi::Simplex_tree_simplex_vertex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>,_boost::iterators::incrementable_traversal_tag>
                          .m_End.v_ || pSVar9 != (Siblings *)local_128._8_8_);
        (this->nodes_label_to_list_)._M_h._M_buckets = (__buckets_ptr)0x0;
      }
      return (Simplex_handle)
             (pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>
              *)this;
    }
    puVar4 = (undefined8 *)__cxa_allocate_exception(8);
    pcVar5 = "simplex of dimension 0";
  }
  *puVar4 = pcVar5;
  __cxa_throw(puVar4,&char_const*::typeinfo,0);
}

Assistant:

Simplex_handle edge_with_same_filtration(Simplex_handle sh) const {
    // See issue #251 for potential speed improvements.
    auto&& vertices = simplex_vertex_range(sh); // vertices in decreasing order
    auto end = std::end(vertices);
    auto vi = std::begin(vertices);
    GUDHI_CHECK(vi != end, "empty simplex");
    auto v0 = *vi;
    ++vi;
    GUDHI_CHECK(vi != end, "simplex of dimension 0");
    if(std::next(vi) == end) return sh; // shortcut for dimension 1
    Static_vertex_vector suffix;
    suffix.push_back(v0);
    auto filt = filtration_(sh);
    do
    {
      Vertex_handle v = *vi;
      auto&& children1 = find_vertex(v)->second.children()->members_;
      for(auto w : suffix){
        // Can we take advantage of the fact that suffix is ordered?
        Simplex_handle s = children1.find(w);
        if(filtration_(s) == filt)
          return s;
      }
      suffix.push_back(v);
    }
    while(++vi != end);
    return null_simplex();
  }